

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O0

void arena_dalloc_no_tcache(tsdn_t *tsdn,void *ptr)

{
  ulong in_RSI;
  undefined1 *in_RDI;
  extent_t *extent;
  _Bool slab;
  szind_t szind;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  uint8_t state_1;
  uint8_t state;
  rtree_leaf_elm_t *elm_2;
  rtree_leaf_elm_t *elm_3;
  uintptr_t subkey_5;
  rtree_leaf_elm_t *leaf_5;
  uint i_1;
  uintptr_t subkey_4;
  rtree_leaf_elm_t *leaf_4;
  uintptr_t subkey_3;
  rtree_leaf_elm_t *leaf_3;
  uintptr_t leafkey_1;
  size_t slot_1;
  uint maskbits_5;
  uint cumbits_5;
  uint ptrbits_5;
  uintptr_t mask_4;
  uint maskbits_6;
  uint cumbits_6;
  uint ptrbits_6;
  uintptr_t mask_5;
  uint maskbits_7;
  uint shiftbits_3;
  uint cumbits_7;
  uint ptrbits_7;
  uintptr_t mask_6;
  uint maskbits_8;
  uint shiftbits_4;
  uint cumbits_8;
  uint ptrbits_8;
  uintptr_t mask_7;
  uint maskbits_9;
  uint shiftbits_5;
  uint cumbits_9;
  uint ptrbits_9;
  uintptr_t bits_1;
  void *result_1;
  uintptr_t bits;
  rtree_leaf_elm_t *elm;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  void *result;
  extent_t *in_stack_fffffffffffff7f0;
  tsdn_t *in_stack_fffffffffffff7f8;
  void *in_stack_fffffffffffff810;
  tsdn_t *in_stack_fffffffffffff818;
  byte local_7dd;
  uint local_7dc;
  rtree_ctx_t *local_7d8;
  undefined1 in_stack_fffffffffffff856;
  undefined1 in_stack_fffffffffffff857;
  rtree_leaf_elm_t *in_stack_fffffffffffff858;
  rtree_ctx_t *in_stack_fffffffffffff860;
  rtree_t *in_stack_fffffffffffff868;
  tsdn_t *in_stack_fffffffffffff870;
  rtree_ctx_t local_638;
  ulong local_4b8;
  undefined1 *local_4b0;
  rtree_ctx_t *local_4a8;
  rtree_ctx_t *local_498;
  rtree_ctx_t *local_490;
  rtree_ctx_t *local_480;
  undefined1 local_441;
  undefined1 local_431;
  extent_t *local_408;
  byte local_3f9;
  ulong local_3f8;
  rtree_ctx_t *local_3f0;
  rtree_t *local_3e8;
  undefined1 *local_3e0;
  ulong local_3d8;
  extent_t *local_3d0;
  byte local_3c1;
  ulong local_3c0;
  rtree_ctx_t *local_3b8;
  rtree_t *local_3b0;
  undefined1 *local_3a8;
  extent_t *local_3a0;
  ulong local_398;
  rtree_leaf_elm_t *local_390;
  uint local_384;
  ulong local_380;
  rtree_leaf_elm_t *local_378;
  ulong local_370;
  rtree_leaf_elm_t *local_368;
  uintptr_t local_360;
  ulong local_358;
  undefined1 local_34a;
  undefined1 local_349;
  ulong local_348;
  rtree_ctx_t *local_340;
  rtree_t *local_338;
  undefined1 *local_330;
  extent_t *local_328;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  ulong local_310;
  undefined8 local_308;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  ulong local_2f0;
  undefined8 local_2e8;
  uint local_2dc;
  undefined4 local_2d8;
  uint local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  ulong local_2c8;
  undefined8 local_2c0;
  uint local_2b4;
  undefined4 local_2b0;
  uint local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  ulong local_2a0;
  undefined8 local_298;
  uint local_28c;
  undefined4 local_288;
  uint local_284;
  undefined4 local_280;
  undefined4 local_27c;
  ulong local_278;
  void *local_270;
  byte local_261;
  extent_t *local_260;
  rtree_t *local_258;
  undefined1 *local_250;
  byte local_241;
  extent_t *local_240;
  rtree_t *local_238;
  undefined1 *local_230;
  void *local_228;
  uint local_21c;
  extent_t *local_218;
  uint local_210;
  int local_20c;
  void *local_208;
  void *local_200;
  rtree_leaf_elm_t *local_1f8;
  byte *local_1f0;
  uint *local_1e8;
  byte local_1d9;
  rtree_ctx_t *local_1d0;
  rtree_t *local_1c8;
  undefined1 *local_1c0;
  undefined1 local_1b1;
  rtree_leaf_elm_t *local_1b0;
  byte local_1a1;
  rtree_ctx_t *local_198;
  rtree_t *local_190;
  rtree_leaf_elm_t *local_180;
  ulong local_178;
  rtree_leaf_elm_t *local_170;
  uint local_164;
  ulong local_160;
  rtree_leaf_elm_t *local_158;
  ulong local_150;
  rtree_leaf_elm_t *local_148;
  uintptr_t local_140;
  ulong local_138;
  undefined1 local_12a;
  undefined1 local_129;
  ulong local_128;
  rtree_ctx_t *local_120;
  rtree_t *local_118;
  rtree_leaf_elm_t *local_108;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined8 local_e8;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined8 local_c8;
  uint local_bc;
  undefined4 local_b8;
  uint local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a0;
  uint local_94;
  undefined4 local_90;
  uint local_8c;
  undefined4 local_88;
  undefined4 local_84;
  ulong local_80;
  undefined8 local_78;
  uint local_6c;
  undefined4 local_68;
  uint local_64;
  undefined4 local_60;
  undefined4 local_5c;
  ulong local_58;
  byte local_49;
  rtree_leaf_elm_t *local_48;
  rtree_t *local_40;
  undefined1 *local_38;
  void *local_30;
  void *local_28;
  uint local_1c;
  rtree_leaf_elm_t *local_18;
  uint local_10;
  int local_c;
  void *local_8;
  
  local_490 = (rtree_ctx_t *)&stack0xfffffffffffff830;
  if (in_RDI == (undefined1 *)0x0) {
    rtree_ctx_data_init(local_490);
    local_480 = local_490;
  }
  else {
    local_431 = *in_RDI;
    local_480 = (rtree_ctx_t *)(in_RDI + 0x30);
  }
  local_7d8 = local_480;
  local_1c8 = &extents_rtree;
  local_1d0 = local_480;
  local_1d9 = 1;
  local_1e8 = &local_7dc;
  local_1f0 = &local_7dd;
  local_190 = &extents_rtree;
  local_198 = local_480;
  local_1a1 = 1;
  local_118 = &extents_rtree;
  local_120 = local_480;
  local_129 = 1;
  local_12a = 0;
  local_f4 = 0x40;
  local_f8 = 0x22;
  local_fc = 0x1e;
  local_138 = in_RSI >> 0x1e & 0xf;
  local_d4 = 0x40;
  local_d8 = 0x22;
  local_dc = 0x1e;
  local_e8 = 0xffffffffc0000000;
  local_140 = in_RSI & 0xffffffffc0000000;
  local_1c0 = in_RDI;
  if (local_480->cache[local_138].leafkey == local_140) {
    local_148 = local_480->cache[local_138].leaf;
    local_ac = 1;
    local_b0 = 0x40;
    local_b4 = 0x34;
    local_b8 = 0xc;
    local_bc = 0x12;
    local_c8 = 0x3ffff;
    local_150 = in_RSI >> 0xc & 0x3ffff;
    local_108 = local_148 + local_150;
  }
  else {
    local_128 = in_RSI;
    if (local_480->l2_cache[0].leafkey == local_140) {
      local_158 = local_480->l2_cache[0].leaf;
      local_480->l2_cache[0].leafkey = local_480->cache[local_138].leafkey;
      local_120->l2_cache[0].leaf = local_120->cache[local_138].leaf;
      local_120->cache[local_138].leafkey = local_140;
      local_120->cache[local_138].leaf = local_158;
      local_80 = local_128;
      local_84 = 1;
      local_88 = 0x40;
      local_8c = 0x34;
      local_90 = 0xc;
      local_94 = 0x12;
      local_a0 = 0x3ffff;
      local_160 = local_128 >> 0xc & 0x3ffff;
      local_108 = local_158 + local_160;
    }
    else {
      for (local_164 = 1; local_164 < 8; local_164 = local_164 + 1) {
        if (local_480->l2_cache[local_164].leafkey == local_140) {
          local_170 = local_480->l2_cache[local_164].leaf;
          if (local_164 == 0) {
            local_480->l2_cache[0].leafkey = local_480->cache[local_138].leafkey;
            local_120->l2_cache[0].leaf = local_120->cache[local_138].leaf;
          }
          else {
            local_480->l2_cache[local_164].leafkey = local_480->l2_cache[local_164 - 1].leafkey;
            local_480->l2_cache[local_164].leaf = local_480->l2_cache[local_164 - 1].leaf;
            local_480->l2_cache[local_164 - 1].leafkey = local_480->cache[local_138].leafkey;
            local_480->l2_cache[local_164 - 1].leaf = local_480->cache[local_138].leaf;
          }
          local_120->cache[local_138].leafkey = local_140;
          local_120->cache[local_138].leaf = local_170;
          local_58 = local_128;
          local_5c = 1;
          local_60 = 0x40;
          local_64 = 0x34;
          local_68 = 0xc;
          local_6c = 0x12;
          local_78 = 0x3ffff;
          local_178 = local_128 >> 0xc & 0x3ffff;
          local_108 = local_170 + local_178;
          goto LAB_002750c7;
        }
      }
      local_108 = rtree_leaf_elm_lookup_hard
                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                             in_stack_fffffffffffff860,(uintptr_t)in_stack_fffffffffffff858,
                             (_Bool)in_stack_fffffffffffff857,(_Bool)in_stack_fffffffffffff856);
    }
  }
LAB_002750c7:
  local_1b0 = local_108;
  if (((local_1a1 & 1) == 0) && (local_108 == (rtree_leaf_elm_t *)0x0)) {
    local_180 = (rtree_leaf_elm_t *)0x0;
  }
  else {
    local_180 = local_108;
  }
  local_1f8 = local_180;
  if (((local_1d9 & 1) == 0) && (local_180 == (rtree_leaf_elm_t *)0x0)) {
    local_1b1 = 1;
  }
  else {
    local_38 = local_1c0;
    local_40 = local_1c8;
    local_48 = local_180;
    local_49 = local_1d9 & 1;
    local_1c = (byte)~local_49 & 1;
    local_18 = local_180;
    in_stack_fffffffffffff810 = (void *)(ulong)local_1c;
    switch(local_1c) {
    case 0:
      local_c = 0;
      break;
    case 1:
      local_c = 2;
    }
    if (local_c - 1U < 2) {
      local_28 = (local_180->le_bits).repr;
    }
    else if (local_c == 5) {
      local_28 = (local_180->le_bits).repr;
    }
    else {
      local_28 = (local_180->le_bits).repr;
    }
    local_200 = local_28;
    local_30 = local_28;
    local_10 = local_1c;
    *local_1e8 = (uint)(ushort)((ulong)local_28 >> 0x30);
    local_8 = local_200;
    *local_1f0 = ((ulong)local_200 & 1) != 0;
    local_1b1 = 0;
  }
  if ((local_7dd & 1) == 0) {
    local_4a8 = &local_638;
    local_4b8 = in_RSI;
    local_4b0 = in_RDI;
    if (in_RDI == (undefined1 *)0x0) {
      rtree_ctx_data_init(local_4a8);
      local_498 = local_4a8;
    }
    else {
      local_441 = *in_RDI;
      local_498 = (rtree_ctx_t *)(in_RDI + 0x30);
    }
    local_3e0 = local_4b0;
    local_3e8 = &extents_rtree;
    local_3f0 = local_498;
    local_3f8 = local_4b8;
    local_3f9 = 1;
    local_3a8 = local_4b0;
    local_3b0 = &extents_rtree;
    local_3b8 = local_498;
    local_3c0 = local_4b8;
    local_3c1 = 1;
    local_330 = local_4b0;
    local_338 = &extents_rtree;
    local_340 = local_498;
    local_348 = local_4b8;
    local_349 = 1;
    local_34a = 0;
    local_310 = local_4b8;
    local_314 = 0x40;
    local_318 = 0x22;
    local_31c = 0x1e;
    local_358 = local_4b8 >> 0x1e & 0xf;
    local_2f0 = local_4b8;
    local_2f4 = 0x40;
    local_2f8 = 0x22;
    local_2fc = 0x1e;
    local_308 = 0xffffffffc0000000;
    local_360 = local_4b8 & 0xffffffffc0000000;
    if (local_498->cache[local_358].leafkey == local_360) {
      local_368 = local_498->cache[local_358].leaf;
      local_2c8 = local_4b8;
      local_2cc = 1;
      local_2d0 = 0x40;
      local_2d4 = 0x34;
      local_2d8 = 0xc;
      local_2dc = 0x12;
      local_2e8 = 0x3ffff;
      local_370 = local_4b8 >> 0xc & 0x3ffff;
      local_328 = (extent_t *)(local_368 + local_370);
    }
    else if (local_498->l2_cache[0].leafkey == local_360) {
      local_378 = local_498->l2_cache[0].leaf;
      local_498->l2_cache[0].leafkey = local_498->cache[local_358].leafkey;
      local_340->l2_cache[0].leaf = local_340->cache[local_358].leaf;
      local_340->cache[local_358].leafkey = local_360;
      local_340->cache[local_358].leaf = local_378;
      local_2a0 = local_348;
      local_2a4 = 1;
      local_2a8 = 0x40;
      local_2ac = 0x34;
      local_2b0 = 0xc;
      local_2b4 = 0x12;
      local_2c0 = 0x3ffff;
      local_380 = local_348 >> 0xc & 0x3ffff;
      local_328 = (extent_t *)(local_378 + local_380);
    }
    else {
      for (local_384 = 1; local_384 < 8; local_384 = local_384 + 1) {
        if (local_498->l2_cache[local_384].leafkey == local_360) {
          local_390 = local_498->l2_cache[local_384].leaf;
          if (local_384 == 0) {
            local_498->l2_cache[0].leafkey = local_498->cache[local_358].leafkey;
            local_340->l2_cache[0].leaf = local_340->cache[local_358].leaf;
          }
          else {
            local_498->l2_cache[local_384].leafkey = local_498->l2_cache[local_384 - 1].leafkey;
            local_498->l2_cache[local_384].leaf = local_498->l2_cache[local_384 - 1].leaf;
            local_498->l2_cache[local_384 - 1].leafkey = local_498->cache[local_358].leafkey;
            local_498->l2_cache[local_384 - 1].leaf = local_498->cache[local_358].leaf;
          }
          local_340->cache[local_358].leafkey = local_360;
          local_340->cache[local_358].leaf = local_390;
          local_278 = local_348;
          local_27c = 1;
          local_280 = 0x40;
          local_284 = 0x34;
          local_288 = 0xc;
          local_28c = 0x12;
          local_298 = 0x3ffff;
          local_398 = local_348 >> 0xc & 0x3ffff;
          local_328 = (extent_t *)(local_390 + local_398);
          goto LAB_00275bee;
        }
      }
      local_328 = (extent_t *)
                  rtree_leaf_elm_lookup_hard
                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                             in_stack_fffffffffffff860,(uintptr_t)in_stack_fffffffffffff858,
                             (_Bool)in_stack_fffffffffffff857,(_Bool)in_stack_fffffffffffff856);
    }
LAB_00275bee:
    local_3d0 = local_328;
    if (((local_3c1 & 1) == 0) && (local_328 == (extent_t *)0x0)) {
      local_3a0 = (extent_t *)0x0;
    }
    else {
      local_3a0 = local_328;
    }
    local_408 = local_3a0;
    if (((local_3f9 & 1) == 0) && (local_3a0 == (extent_t *)0x0)) {
      local_3d8 = 0;
    }
    else {
      local_250 = local_3e0;
      local_258 = local_3e8;
      local_260 = local_3a0;
      local_261 = local_3f9 & 1;
      local_230 = local_3e0;
      local_238 = local_3e8;
      local_240 = local_3a0;
      local_21c = (byte)~local_261 & 1;
      local_218 = local_3a0;
      in_stack_fffffffffffff7f8 = (tsdn_t *)(ulong)local_21c;
      switch(local_21c) {
      case 0:
        local_20c = 0;
        break;
      case 1:
        local_20c = 2;
      }
      if (local_20c - 1U < 2) {
        local_228 = ((atomic_p_t *)&local_3a0->e_bits)->repr;
      }
      else if (local_20c == 5) {
        local_228 = ((atomic_p_t *)&local_3a0->e_bits)->repr;
      }
      else {
        local_228 = ((atomic_p_t *)&local_3a0->e_bits)->repr;
      }
      local_270 = local_228;
      local_208 = local_228;
      local_3d8 = ((long)local_228 << 0x10) >> 0x10 & 0xfffffffffffffffe;
      in_stack_fffffffffffff7f0 = local_3a0;
      local_241 = local_261;
      local_210 = local_21c;
    }
    large_dalloc(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  }
  else {
    arena_dalloc_small(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  }
  return;
}

Assistant:

static inline void
arena_dalloc_no_tcache(tsdn_t *tsdn, void *ptr) {
	assert(ptr != NULL);

	rtree_ctx_t rtree_ctx_fallback;
	rtree_ctx_t *rtree_ctx = tsdn_rtree_ctx(tsdn, &rtree_ctx_fallback);

	szind_t szind;
	bool slab;
	rtree_szind_slab_read(tsdn, &extents_rtree, rtree_ctx, (uintptr_t)ptr,
	    true, &szind, &slab);

	if (config_debug) {
		extent_t *extent = rtree_extent_read(tsdn, &extents_rtree,
		    rtree_ctx, (uintptr_t)ptr, true);
		assert(szind == extent_szind_get(extent));
		assert(szind < SC_NSIZES);
		assert(slab == extent_slab_get(extent));
	}

	if (likely(slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		extent_t *extent = iealloc(tsdn, ptr);
		large_dalloc(tsdn, extent);
	}
}